

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType2::Decode(GridDataType2 *this,KDataStream *stream)

{
  undefined1 *T;
  pointer pfVar1;
  KUINT16 KVar2;
  KException *this_00;
  KUINT16 i;
  ushort uVar3;
  allocator<char> local_51;
  KFLOAT32 tmp;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  if (7 < KVar2) {
    pfVar1 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    GridData::Decode(&this->super_GridData,stream);
    T = &(this->super_GridData).field_0xc;
    KDataStream::Read<unsigned_short>(stream,(unsigned_short *)T);
    tmp = 0.0;
    for (uVar3 = 0; uVar3 < *(ushort *)T; uVar3 = uVar3 + 1) {
      KDataStream::Read<float>(stream,(float *)&tmp);
      std::vector<float,_std::allocator<float>_>::push_back
                (&this->m_vf32Values,(value_type_conflict6 *)&tmp);
    }
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"Decode",&local_51);
  KException::KException(this_00,(KString *)&tmp,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridDataType2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vf32Values.clear();

    GridData::Decode( stream );

    stream >> m_ui16NumValues;

    KFLOAT32 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vf32Values.push_back( tmp );
    }

    stream >> m_ui16Padding;
}